

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::WriteFontCollection(FontCollection *font_collection,uint8_t *dst,size_t dst_size)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  pointer pFVar7;
  bool bVar8;
  size_t local_38;
  
  local_38 = 0;
  if (font_collection->flavor == 0x74746366) {
    *dst = 't';
    dst[1] = 't';
    dst[2] = 'c';
    dst[3] = 'f';
    uVar2 = font_collection->header_version;
    dst[4] = (uint8_t)(uVar2 >> 0x18);
    dst[5] = (uint8_t)(uVar2 >> 0x10);
    dst[6] = (uint8_t)(uVar2 >> 8);
    dst[7] = (uint8_t)uVar2;
    lVar4 = ((long)(font_collection->fonts).
                   super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(font_collection->fonts).
                   super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    dst[8] = (uint8_t)((ulong)lVar4 >> 0x18);
    dst[9] = (uint8_t)((ulong)lVar4 >> 0x10);
    dst[10] = (uint8_t)((ulong)lVar4 >> 8);
    dst[0xb] = (uint8_t)lVar4;
    if ((font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      sVar5 = 0xc;
    }
    else {
      sVar5 = 0xc;
      uVar6 = 0;
      do {
        puVar1 = dst + uVar6 * 4 + 0xc;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        sVar5 = sVar5 + 4;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(((long)(font_collection->fonts).
                                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(font_collection->fonts).
                                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x6db6db6db6db6db7));
    }
    local_38 = sVar5;
    if (font_collection->header_version == 0x20000) {
      dst[sVar5] = '\0';
      dst[sVar5 + 1] = '\0';
      dst[sVar5 + 2] = '\0';
      dst[sVar5 + 3] = '\0';
      dst[sVar5 + 4] = '\0';
      dst[sVar5 + 5] = '\0';
      dst[sVar5 + 6] = '\0';
      dst[sVar5 + 7] = '\0';
      dst[sVar5 + 8] = '\0';
      dst[sVar5 + 9] = '\0';
      dst[sVar5 + 10] = '\0';
      local_38 = sVar5 + 0xc;
      dst[sVar5 + 0xb] = '\0';
    }
    pFVar7 = (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar8 = (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
            _M_impl.super__Vector_impl_data._M_finish == pFVar7;
    if (!bVar8) {
      lVar4 = 0;
      uVar6 = 0;
      do {
        *(uint *)(dst + uVar6 * 4 + 0xc) =
             (uint)local_38 >> 0x18 | ((uint)local_38 & 0xff0000) >> 8 |
             ((uint)local_38 & 0xff00) << 8 | (uint)local_38 << 0x18;
        bVar3 = WriteFont((Font *)((long)&pFVar7->flavor + lVar4),&local_38,dst,dst_size);
        if (!bVar3) {
          return bVar8;
        }
        uVar6 = uVar6 + 1;
        pFVar7 = (font_collection->fonts).
                 super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x38;
        bVar3 = uVar6 < (ulong)(((long)(font_collection->fonts).
                                       super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7 >>
                                3) * 0x6db6db6db6db6db7);
        bVar8 = !bVar3;
      } while (bVar3);
    }
  }
  else {
    bVar8 = WriteFont((font_collection->fonts).
                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                      super__Vector_impl_data._M_start,&local_38,dst,dst_size);
  }
  return bVar8;
}

Assistant:

bool WriteFontCollection(const FontCollection& font_collection, uint8_t* dst,
                         size_t dst_size) {
  size_t offset = 0;

  // It's simpler if this just a simple sfnt
  if (font_collection.flavor != kTtcFontFlavor) {
    return WriteFont(font_collection.fonts[0], &offset, dst, dst_size);
  }

  // Write TTC header
  StoreU32(kTtcFontFlavor, &offset, dst);
  StoreU32(font_collection.header_version, &offset, dst);
  StoreU32(font_collection.fonts.size(), &offset, dst);

  // Offset Table, zeroed for now
  size_t offset_table = offset;  // where to write offsets later
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    StoreU32(0, &offset, dst);
  }

  if (font_collection.header_version == 0x00020000) {
    StoreU32(0, &offset, dst);  // ulDsigTag
    StoreU32(0, &offset, dst);  // ulDsigLength
    StoreU32(0, &offset, dst);  // ulDsigOffset
  }

  // Write fonts and their offsets.
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    const auto& font = font_collection.fonts[i];
    StoreU32(offset, &offset_table, dst);
    if (!WriteFont(font, &offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}